

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O2

ObjectPtr __thiscall ICM::DefFunc::Calc::NumCall::func(NumCall *this,DataList *list)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  int in_ECX;
  long *in_RDX;
  unsigned_long i;
  long lVar3;
  void *in_R8;
  
  iVar2 = Object::clone(*(Object **)in_RDX[1],(__fn *)list,in_RDX,in_ECX,in_R8);
  lVar1 = *in_RDX;
  for (lVar3 = 1; lVar1 != lVar3; lVar3 = lVar3 + 1) {
    std::function<void_(long_&,_const_long_&)>::operator()
              ((function<void_(long_&,_const_long_&)> *)&list->_data,
               (long *)((_func_int **)CONCAT44(extraout_var,iVar2))[1],
               *(long **)(*(long *)(in_RDX[1] + lVar3 * 8) + 8));
  }
  (this->super_FI)._vptr_FuncInitObject = (_func_int **)CONCAT44(extraout_var,iVar2);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					Object *tmp = list.front()->clone();
					for (auto i : Range<size_t>(1, list.size()))
						fp(tmp->dat<T_Number>(), list[i]->dat<T_Number>());
					return ObjectPtr(tmp);
				}